

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deriv.c
# Opt level: O2

void checkmatch(int blocktype)

{
  if (blocktype != 0x10a) {
    diag("MATCH block can only be in DERIVATIVE block",(char *)0x0);
  }
  matchused = 1;
  if (match_init != (List *)0x0 || match_bound != (List *)0x0) {
    diag("Only one MATCH block allowed",(char *)0x0);
  }
  if (indepsym == (Symbol *)0x0) {
    diag("INDEPENDENT variable must be declared before MATCH"," statement");
  }
  match_bound = newlist();
  match_init = newlist();
  return;
}

Assistant:

void checkmatch(blocktype) int blocktype; {
	if (blocktype != DERIVATIVE) {
		diag("MATCH block can only be in DERIVATIVE block", (char *)0);
	}
	matchused = 1; /*communicate with massagederiv*/
	if (match_bound || match_init) {
		diag("Only one MATCH block allowed", (char *)0);
	}
	if (!indepsym) {
		diag("INDEPENDENT variable must be declared before MATCH",
		 " statement");
	}
	match_bound = newlist();
	match_init = newlist();
}